

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall Parser::note(Parser *this,char *msg)

{
  undefined4 uVar1;
  long lVar2;
  Symbol *pSVar3;
  undefined4 uVar6;
  char *pcVar4;
  qsizetype qVar5;
  int *piVar7;
  Data *in_RCX;
  long in_FS_OFFSET;
  QByteArrayView formatStringSuffix;
  QByteArrayView msg_00;
  Symbol local_48;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((msg != (char *)0x0) && (this->displayNotes != false)) {
    lVar2 = this->index;
    if (lVar2 < 1) {
      local_48.lineNum = -1;
      local_48.token = NOTOKEN;
      local_48.lex.d.d._0_4_ = 0;
      local_48.lex.d.d._4_4_ = 0;
      local_48.lex.d.ptr._0_4_ = 0;
      local_48.lex.d.ptr._4_4_ = 0;
      local_48.lex.d.size._0_4_ = 0;
      local_48.lex.d.size._4_4_ = 0;
      local_48.from._0_4_ = 0;
      local_48.from._4_4_ = 0;
      local_48.len = -1;
    }
    else {
      pSVar3 = (this->symbols).d.ptr;
      uVar1 = pSVar3[lVar2 + -1].lineNum;
      uVar6 = pSVar3[lVar2 + -1].token;
      in_RCX = pSVar3[lVar2 + -1].lex.d.d;
      local_48.lex.d.d._0_4_ = SUB84(in_RCX,0);
      local_48.lex.d.d._4_4_ = (undefined4)((ulong)in_RCX >> 0x20);
      pcVar4 = pSVar3[lVar2 + -1].lex.d.ptr;
      local_48.lex.d.ptr._0_4_ = SUB84(pcVar4,0);
      local_48.lex.d.ptr._4_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
      qVar5 = pSVar3[lVar2 + -1].lex.d.size;
      local_48.lex.d.size._0_4_ = (undefined4)qVar5;
      local_48.lex.d.size._4_4_ = (undefined4)((ulong)qVar5 >> 0x20);
      if (in_RCX != (Data *)0x0) {
        LOCK();
        (in_RCX->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (in_RCX->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_48.len = pSVar3[lVar2 + -1].len;
      local_48.from._0_4_ = (undefined4)pSVar3[lVar2 + -1].from;
      local_48.from._4_4_ = (undefined4)((ulong)pSVar3[lVar2 + -1].from >> 0x20);
      local_48.lineNum = uVar1;
      local_48.token = uVar6;
    }
    formatStringSuffix.m_data = "note: %s\n";
    formatStringSuffix.m_size = 9;
    msg_00.m_data = msg;
    msg_00.m_size = (qsizetype)in_RCX;
    printMsg(this,formatStringSuffix,msg_00,&local_48);
    piVar7 = (int *)CONCAT44(local_48.lex.d.d._4_4_,local_48.lex.d.d._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_48.lex.d.d._4_4_,local_48.lex.d.d._0_4_),1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Parser::note(const char *msg) {
    if (displayNotes && msg)
        printMsg("note: %s\n", msg, index > 0 ? symbol() : Symbol{});
}